

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_compress.cc
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  char cVar2;
  uint uVar3;
  size_t output_size;
  string output;
  WOFF2Params params;
  string input;
  string outfilename;
  string local_70;
  string local_50;
  string filename;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&filename,argv[1],(allocator *)&params);
    std::__cxx11::string::find_last_of((char *)&filename,0x103039);
    std::__cxx11::string::substr((ulong)&params,(ulong)&filename);
    std::operator+(&outfilename,&params.extended_metadata,".woff2");
    std::__cxx11::string::~string((string *)&params);
    fprintf(_stdout,"Processing %s => %s\n",filename._M_dataplus._M_p,outfilename._M_dataplus._M_p);
    std::__cxx11::string::string((string *)&local_50,(string *)&filename);
    woff2::GetFileContent(&input,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    output_size = woff2::MaxWOFF2CompressedSize
                            ((uchar *)input._M_dataplus._M_p,input._M_string_length);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    std::__cxx11::string::_M_construct((ulong)&output,(char)output_size);
    _Var1._M_p = output._M_dataplus._M_p;
    woff2::WOFF2Params::WOFF2Params(&params);
    cVar2 = woff2::ConvertTTFToWOFF2
                      ((uchar *)input._M_dataplus._M_p,input._M_string_length,(uchar *)_Var1._M_p,
                       &output_size,&params);
    if (cVar2 == '\0') {
      fwrite("Compression failed.\n",0x14,1,_stderr);
    }
    else {
      std::__cxx11::string::resize((ulong)&output);
      std::__cxx11::string::string((string *)&local_70,(string *)&outfilename);
      woff2::SetFileContents
                (&local_70,(iterator)output._M_dataplus._M_p,
                 (iterator)(output._M_dataplus._M_p + output._M_string_length));
      std::__cxx11::string::~string((string *)&local_70);
    }
    uVar3 = (uint)(cVar2 == '\0');
    std::__cxx11::string::~string((string *)&params);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::string::~string((string *)&outfilename);
    std::__cxx11::string::~string((string *)&filename);
  }
  else {
    fwrite("One argument, the input filename, must be provided.\n",0x34,1,_stderr);
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int main(int argc, char **argv) {
  using std::string;

  if (argc != 2) {
    fprintf(stderr, "One argument, the input filename, must be provided.\n");
    return 1;
  }

  string filename(argv[1]);
  string outfilename = filename.substr(0, filename.find_last_of(".")) + ".woff2";
  fprintf(stdout, "Processing %s => %s\n",
    filename.c_str(), outfilename.c_str());
  string input = woff2::GetFileContent(filename);

  const uint8_t* input_data = reinterpret_cast<const uint8_t*>(input.data());
  size_t output_size = woff2::MaxWOFF2CompressedSize(input_data, input.size());
  string output(output_size, 0);
  uint8_t* output_data = reinterpret_cast<uint8_t*>(&output[0]);

  woff2::WOFF2Params params;
  if (!woff2::ConvertTTFToWOFF2(input_data, input.size(),
                                output_data, &output_size, params)) {
    fprintf(stderr, "Compression failed.\n");
    return 1;
  }
  output.resize(output_size);

  woff2::SetFileContents(outfilename, output.begin(), output.end());

  return 0;
}